

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

HomogeneousMajorantIterator * __thiscall
pbrt::CloudMedium::SampleRay(CloudMedium *this,Ray *ray,Float raytMax,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Vector3f d;
  Point3f o;
  bool bVar3;
  SampledWavelengths *in_RDX;
  DenselySampledSpectrum *in_RSI;
  Ray *in_RDI;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  SampledSpectrum SVar12;
  SampledSpectrum sigma_t;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  Float tMax;
  Float tMin;
  Float *in_stack_000000d8;
  Ray *in_stack_000000e0;
  Ray *this_00;
  DenselySampledSpectrum *this_01;
  Float *in_stack_ffffffffffffff28;
  Float *in_stack_ffffffffffffff30;
  Float in_stack_ffffffffffffff3c;
  Bounds3<float> *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff7c;
  Float local_50;
  Float local_4c;
  undefined1 auVar4 [64];
  undefined1 auVar8 [64];
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  Transform::ApplyInverse((Transform *)lambda,in_stack_000000e0,in_stack_000000d8);
  Ray::operator=(this_00,in_RDI);
  auVar7 = (undefined1  [56])0x0;
  auVar11 = (undefined1  [56])0x0;
  o.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffff7c;
  o.super_Tuple3<pbrt::Point3,_float>.x = (in_RDX->pdf).values[1];
  o.super_Tuple3<pbrt::Point3,_float>.z = (float)*(undefined8 *)(in_RDX->lambda).values;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff60;
  d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffff5c;
  bVar3 = Bounds3<float>::IntersectP
                    (in_stack_ffffffffffffff40,o,d,in_stack_ffffffffffffff3c,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar3) {
    SVar12 = DenselySampledSpectrum::Sample(this_01,in_RDX);
    auVar8._0_8_ = SVar12.values.values._8_8_;
    auVar8._8_56_ = auVar11;
    auVar4._0_8_ = SVar12.values.values._0_8_;
    auVar4._8_56_ = auVar7;
    vmovlpd_avx(auVar4._0_16_);
    vmovlpd_avx(auVar8._0_16_);
    SVar12 = DenselySampledSpectrum::Sample(this_01,in_RDX);
    auVar9._0_8_ = SVar12.values.values._8_8_;
    auVar9._8_56_ = auVar11;
    auVar5._0_8_ = SVar12.values.values._0_8_;
    auVar5._8_56_ = auVar7;
    vmovlpd_avx(auVar5._0_16_);
    vmovlpd_avx(auVar9._0_16_);
    SVar12 = SampledSpectrum::operator+((SampledSpectrum *)in_RSI,(SampledSpectrum *)this_00);
    auVar10._0_8_ = SVar12.values.values._8_8_;
    auVar10._8_56_ = auVar11;
    auVar6._0_8_ = SVar12.values.values._0_8_;
    auVar6._8_56_ = auVar7;
    uVar1 = vmovlpd_avx(auVar6._0_16_);
    uVar2 = vmovlpd_avx(auVar10._0_16_);
    SVar12.values.values[2] = (float)(int)uVar2;
    SVar12.values.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
    SVar12.values.values[0] = (float)(int)uVar1;
    SVar12.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
    HomogeneousMajorantIterator::HomogeneousMajorantIterator
              ((HomogeneousMajorantIterator *)in_RDI,local_4c,local_50,SVar12);
  }
  else {
    HomogeneousMajorantIterator::HomogeneousMajorantIterator((HomogeneousMajorantIterator *)this_00)
    ;
  }
  return (HomogeneousMajorantIterator *)this_00;
}

Assistant:

SampleRay(Ray ray, Float raytMax,
                                          const SampledWavelengths &lambda) const {
        // Transform ray to medium's space and compute bounds overlap
        ray = renderFromMedium.ApplyInverse(ray, &raytMax);
        Float tMin, tMax;
        if (!bounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
            return {};
        DCHECK_LE(tMax, raytMax);

        // Compute $\sigmat$ bound for cloud medium and initialize majorant iterator
        SampledSpectrum sigma_a = sigma_a_spec.Sample(lambda);
        SampledSpectrum sigma_s = sigma_s_spec.Sample(lambda);
        SampledSpectrum sigma_t = sigma_a + sigma_s;
        return HomogeneousMajorantIterator(tMin, tMax, sigma_t);
    }